

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void kratos::LatchVisitor::check_stmt_block
               (StmtBlock *stmt,Var *var,
               vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *stmts,bool full_branch)

{
  bool bVar1;
  StmtException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  Stmt **local_80;
  undefined8 uStack_78;
  const_iterator local_60;
  const_iterator local_58;
  undefined8 uStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_48._9_7_ = 0;
  local_48._M_pod_data[8] = full_branch;
  pcStack_30 = std::
               _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:550:22)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:550:22)>
             ::_M_manager;
  local_48._M_unused._M_object = var;
  bVar1 = check_stmt_condition
                    (&stmt->super_Stmt,(function<bool_(kratos::Stmt_*)> *)&local_48,false,
                     full_branch);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  if (bVar1) {
    return;
  }
  this = (StmtException *)__cxa_allocate_exception(0x10);
  (*(var->super_IRNode)._vptr_IRNode[0x1f])(&local_80,var);
  local_58._M_current = local_80;
  uStack_50 = uStack_78;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x1d;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)&local_48,(detail *)"{0} will be inferred as latch",format_str,args);
  local_58._M_current =
       (stmts->super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_60._M_current =
       (stmts->super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  StmtException::StmtException(this,(string *)&local_48,&local_58,&local_60);
  __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void check_stmt_block(StmtBlock* stmt, Var* var, const std::vector<Stmt*>& stmts,
                                 bool full_branch) {
        auto check = [=](Stmt* s) -> bool {
            if (s->type() == StatementType::Assign) {
                auto* assign = reinterpret_cast<AssignStmt*>(s);
                auto* left = assign->left();
                if (left->type() == VarType::Slice) {
                    auto* slice = reinterpret_cast<VarSlice*>(left);
                    left = const_cast<Var*>(slice->get_var_root_parent());
                }
                return left == var;
            } else if (s->type() == StatementType::Block) {
                auto* block = reinterpret_cast<StmtBlock*>(s);
                if (block->block_type() == StatementBlockType::Function) {
                    // function call to set the variable
                    return check_stmt_block(block, var, full_branch);
                }
            }
            return false;
        };
        if (!check_stmt_condition(stmt, check, false, full_branch)) {
            // things goes wrong
            // need to recover all the statements
            throw StmtException(::format("{0} will be inferred as latch", var->to_string()),
                                stmts.begin(), stmts.end());
        }
    }